

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessagesTestCase.cpp
# Opt level: O0

void __thiscall SuiteMessageTests::TestreplaceGroup::TestreplaceGroup(TestreplaceGroup *this)

{
  char *suiteName;
  TestreplaceGroup *this_local;
  
  suiteName = SuiteMessageTests::UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"replaceGroup",suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/MessagesTestCase.cpp"
             ,0x24c);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__TestreplaceGroup_00458cf0;
  return;
}

Assistant:

TEST(replaceGroup)
{
  FIX::Message object;
  object.setField( ListID( "1" ) );
  object.setField( BidType( 0 ) );
  object.setField( TotNoOrders( 3 ) );

  FIX42::NewOrderList::NoOrders group;
  group.set( ClOrdID( "A" ) );
  group.set( ListSeqNo( 1 ) );
  group.set( Symbol( "DELL" ) );
  group.set( Side( '1' ) );
  object.addGroup( group );

  group.set( ClOrdID( "B" ) );
  group.set( ListSeqNo( 2 ) );
  group.set( Symbol( "LNUX" ) );
  group.set( Side( '2' ) );
  object.addGroup( group );

  group.set( ClOrdID( "C" ) );
  group.set( ListSeqNo( 3 ) );
  group.set( Symbol( "RHAT" ) );
  group.set( Side( '3' ) );
  object.addGroup( group );

  group.set( ClOrdID( "D" ) );
  group.set( ListSeqNo( 4 ) );
  group.set( Symbol( "AAPL" ) );
  group.set( Side( '4' ) );
  object.replaceGroup( 2, group );

  NoOrders noOrders;

  CHECK( object.hasGroup(1, group) );
  CHECK( object.hasGroup(2, group) );
  CHECK( object.hasGroup(3, group) );
  CHECK_EQUAL( 3lu, object.groupCount(FIX::FIELD::NoOrders) );
  object.getField( noOrders );
  CHECK_EQUAL( 3, noOrders );

  ClOrdID clOrdID;
  object.getGroup( 1, group );
  CHECK_EQUAL( "A", group.getField(clOrdID).getString() );
  object.getGroup( 2, group );
  CHECK_EQUAL( "D", group.getField(clOrdID).getString() );
  object.getGroup( 3, group );
  CHECK_EQUAL( "C", group.getField(clOrdID).getString() );
}